

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest12::iterate(FunctionalTest12 *this)

{
  bool bVar1;
  bool bVar2;
  NotSupportedError *this_00;
  char *description;
  TestContext *this_01;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_ARB_shader_subroutine is not supported.",&local_39);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_shader_atomic_counters");
  bVar1 = true;
  if (bVar2) {
    bVar1 = testAtomic(this);
  }
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_shader_storage_buffer_object");
  if (bVar2) {
    bVar2 = testSSBO(this);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_shader_image_load_store");
  if (bVar2) {
    bVar2 = testImage(this);
    bVar1 = (bool)(bVar2 & bVar1);
  }
  if (bVar1 != false) {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Fail";
  }
  tcu::TestContext::setTestResult(this_01,(uint)(bVar1 == false),description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest12::iterate()
{
	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	bool result = true;

	/* Test atomic counters */
	if (true == m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_atomic_counters"))
	{
		if (false == testAtomic())
		{
			result = false;
		}
	}

	/* Test shader storage buffer */
	if (true == m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_storage_buffer_object"))
	{
		if (false == testSSBO())
		{
			result = false;
		}
	}

	/* Test image load store */
	if (true == m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_image_load_store"))
	{
		if (false == testImage())
		{
			result = false;
		}
	}

	/* Set result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}